

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  text msg;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opt).verbose == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_70);
  }
  else {
    local_70 = &local_60;
    local_68 = 0;
    local_60 = '\0';
    lVar3 = 0;
    for (lVar2 = 0;
        pbVar1 = (this->ctx).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar2 != (long)(this->ctx).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
        lVar2 = lVar2 + 1) {
      std::operator+(&local_50,"\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      lVar3 = lVar3 + 0x20;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_70 == &local_60) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_70;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    }
    __return_storage_ptr__->_M_string_length = local_68;
    local_68 = 0;
    local_60 = '\0';
    local_70 = &local_60;
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }